

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O2

void __thiscall helics::ActionMessage::ActionMessage(ActionMessage *this,void *data,size_t size)

{
  string_view data_00;
  
  ActionMessage(this);
  data_00._M_str = (char *)data;
  data_00._M_len = size;
  from_string(this,data_00);
  return;
}

Assistant:

ActionMessage::ActionMessage(const void* data, size_t size): ActionMessage()
{
    from_string(std::string_view(static_cast<const char*>(data), size));
}